

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

bool QSslSocket::isClassImplemented(ImplementedClass cl,QString *backendName)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QSsl::ImplementedClass> QStack_38;
  ImplementedClass local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = cl;
  implementedClasses((QList<QSsl::ImplementedClass> *)&QStack_38,backendName);
  bVar1 = QListSpecialMethodsBase<QSsl::ImplementedClass>::contains<QSsl::ImplementedClass>
                    ((QListSpecialMethodsBase<QSsl::ImplementedClass> *)&QStack_38,&local_1c);
  QArrayDataPointer<QSsl::ImplementedClass>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslSocket::isClassImplemented(QSsl::ImplementedClass cl, const QString &backendName)
{
    return implementedClasses(backendName).contains(cl);
}